

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_prefix.c
# Opt level: O0

void ipv4prefix_zero_host(in_addr *addr,uint8_t prefix)

{
  uint32_t uVar1;
  uint32_t local_1c;
  uint local_18;
  uint32_t mask;
  uint32_t i;
  uint8_t prefix_local;
  in_addr *addr_local;
  
  local_1c = 0;
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    local_1c = local_1c << 1;
    if (local_18 < prefix) {
      local_1c = local_1c | 1;
    }
  }
  uVar1 = htonl(local_1c);
  addr->s_addr = uVar1 & addr->s_addr;
  return;
}

Assistant:

static void
ipv4prefix_zero_host(struct in_addr *addr, uint8_t prefix)
{
    uint32_t i, mask;

    /* zero host bits */
    mask = 0;
    for (i = 0; i < 32; ++i) {
        mask <<= 1;
        if (prefix > i) {
            mask |= 1;
        }
    }
    mask = htonl(mask);
    addr->s_addr &= mask;
}